

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

void __thiscall
icu_63::FixedDecimal::FixedDecimal(FixedDecimal *this,UnicodeString *num,UErrorCode *status)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  double n;
  StringPiece n_00;
  CharString cs;
  DecimalQuantity dl;
  
  (this->super_IFixedDecimal)._vptr_IFixedDecimal = (_func_int **)&PTR__FixedDecimal_0039eca0;
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__FixedDecimal_0039ece0;
  MaybeStackArray<char,_40>::MaybeStackArray(&cs.buffer);
  cs.len = 0;
  *cs.buffer.ptr = '\0';
  CharString::appendInvariantChars(&cs,num,status);
  icu_63::number::impl::DecimalQuantity::DecimalQuantity(&dl);
  n_00.length_ = cs.len;
  n_00.ptr_ = cs.buffer.ptr;
  n_00._12_4_ = 0;
  icu_63::number::impl::DecimalQuantity::setToDecNumber(&dl,n_00,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar2 = UnicodeString::indexOf(num,L'.');
    n = icu_63::number::impl::DecimalQuantity::toDouble(&dl);
    if (uVar2 == 0xffffffff) {
      init(this,(EVP_PKEY_CTX *)0x0);
    }
    else {
      sVar1 = (num->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (num->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      getFractionalDigits(n,~uVar2 + iVar3);
      init(this,(EVP_PKEY_CTX *)(ulong)(~uVar2 + iVar3));
    }
  }
  else {
    init(this,(EVP_PKEY_CTX *)0x0);
  }
  icu_63::number::impl::DecimalQuantity::~DecimalQuantity(&dl);
  MaybeStackArray<char,_40>::~MaybeStackArray(&cs.buffer);
  return;
}

Assistant:

FixedDecimal::FixedDecimal(const UnicodeString &num, UErrorCode &status) {
    CharString cs;
    cs.appendInvariantChars(num, status);
    DecimalQuantity dl;
    dl.setToDecNumber(cs.toStringPiece(), status);
    if (U_FAILURE(status)) {
        init(0, 0, 0);
        return;
    }
    int32_t decimalPoint = num.indexOf(DOT);
    double n = dl.toDouble();
    if (decimalPoint == -1) {
        init(n, 0, 0);
    } else {
        int32_t v = num.length() - decimalPoint - 1;
        init(n, v, getFractionalDigits(n, v));
    }
}